

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O2

double __thiscall chrono::ChContinuumDistribution::GetRandom(ChContinuumDistribution *this)

{
  ChVectorDynamic<> *this_00;
  ChVectorDynamic<> *this_01;
  long index;
  Scalar *pSVar1;
  long index_00;
  double dVar2;
  undefined1 auVar3 [16];
  Scalar SVar4;
  undefined1 auVar5 [16];
  Scalar SVar6;
  undefined1 auVar7 [16];
  double local_38;
  double local_30;
  
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->x,0);
  local_30 = *pSVar1;
  this_00 = &this->cdf_x;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
  local_38 = *pSVar1;
  this_01 = &this->cdf_y;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0);
  SVar4 = *pSVar1;
  dVar2 = ChRandom();
  index = 0;
  do {
    index_00 = index;
    if ((this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
        -1 <= index_00) {
      SVar6 = 0.0;
      goto LAB_00a423cb;
    }
    index = index_00 + 1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index)
    ;
  } while ((*pSVar1 < dVar2) ||
          (pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01
                               ,index_00), dVar2 <= *pSVar1));
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index_00
                     );
  local_30 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index);
  local_38 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index_00
                     );
  SVar6 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index);
  SVar4 = *pSVar1;
LAB_00a423cb:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_30;
  auVar5._0_8_ = (dVar2 - SVar6) / (SVar4 - SVar6);
  auVar5._8_8_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_38 - local_30;
  auVar3 = vfmadd213sd_fma(auVar3,auVar5,auVar7);
  return auVar3._0_8_;
}

Assistant:

double ChContinuumDistribution::GetRandom() {
    double mx1 = x(0);
    double mx2 = cdf_x(0);
    double my1 = 0;
    double my2 = cdf_y(0);

    double rand = ChRandom();
    for (int i = 0; i < x.size() - 1; i++) {
        if ((rand <= cdf_y(i + 1)) && (rand > cdf_y(i))) {
            mx1 = cdf_x(i);
            mx2 = cdf_x(i + 1);
            my1 = cdf_y(i);
            my2 = cdf_y(i + 1);
            break;
        }
    }
    // linear interp
    double val = mx1 + ((rand - my1) / (my2 - my1)) * (mx2 - mx1);
    return val;
}